

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O0

exr_result_t
internal_exr_undo_rle
          (exr_decode_pipeline_t *decode,void *src,uint64_t packsz,void *out,uint64_t outsz)

{
  exr_result_t eVar1;
  uint64_t uVar2;
  void *in_RCX;
  size_t *in_RDX;
  void **in_RSI;
  uint64_t in_RDI;
  uint64_t in_R8;
  uint64_t unpackb;
  exr_result_t rv;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar1 = internal_decode_alloc_buffer
                    ((exr_decode_pipeline_t *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (exr_transcoding_pipeline_buffer_id_t)(in_RDI >> 0x20),in_RSI,in_RDX,
                     (size_t)in_RCX);
  if (eVar1 == 0) {
    uVar2 = internal_rle_decompress
                      ((uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(uint8_t *)in_RSI,(uint64_t)in_RDX);
    if (uVar2 == in_R8) {
      unpredict_and_reorder(in_RCX,*(void **)(in_RDI + 0xa0),in_R8);
      eVar1 = 0;
    }
    else {
      eVar1 = 0x17;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_rle (
    exr_decode_pipeline_t* decode,
    const void*            src,
    uint64_t               packsz,
    void*                  out,
    uint64_t               outsz)
{
    exr_result_t rv;
    uint64_t     unpackb;
    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        outsz);
    if (rv != EXR_ERR_SUCCESS) return rv;

    unpackb =
        internal_rle_decompress ((uint8_t*) decode->scratch_buffer_1, outsz, (const uint8_t*) src, packsz);
    if (unpackb != outsz) return EXR_ERR_CORRUPT_CHUNK;

    unpredict_and_reorder (out, decode->scratch_buffer_1, outsz);
    return EXR_ERR_SUCCESS;
}